

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepTiledInputFile::readTiles
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  int *v;
  LineOrder LVar1;
  Data *pDVar2;
  pointer ppTVar3;
  TileBuffer *pTVar4;
  InputStreamMutex *pIVar5;
  Int64 IVar6;
  ulong uVar7;
  pointer ppTVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int n;
  bool bVar12;
  int iVar13;
  int iVar14;
  Int64 *pIVar15;
  Int64 IVar16;
  undefined4 extraout_var_00;
  void *pvVar17;
  Task *this_00;
  InputExc *pIVar18;
  ostream *poVar19;
  ArgExc *pAVar20;
  IoExc *this_01;
  int iVar21;
  long lVar22;
  int dy;
  string *psVar23;
  int dx;
  string *psVar24;
  ulong uVar25;
  char *pcVar26;
  TaskGroup taskGroup;
  stringstream _iex_throw_s;
  undefined4 uStack_33c;
  ostream local_330 [376];
  stringstream _iex_replace_s;
  undefined4 extraout_var;
  
  __iex_replace_s = this->_data->_streamData;
  std::mutex::lock(&__iex_replace_s->super_Mutex);
  pDVar2 = this->_data;
  if ((pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar20,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  bVar12 = isValidLevel(this,lx,ly);
  if (!bVar12) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar19 = std::operator<<(local_330,"Level coordinate (");
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,lx);
    poVar19 = std::operator<<(poVar19,", ");
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,ly);
    std::operator<<(poVar19,") is invalid.");
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iVar13 = dx2;
  if (dx1 < dx2) {
    iVar13 = dx1;
  }
  if (dx2 < dx1) {
    dx2 = dx1;
  }
  dy = dy2;
  if (dy1 < dy2) {
    dy = dy1;
  }
  if (dy2 < dy1) {
    dy2 = dy1;
  }
  LVar1 = pDVar2->lineOrder;
  iVar21 = dy + -1;
  if (LVar1 != DECREASING_Y) {
    iVar21 = dy2 + 1;
  }
  IlmThread_2_5::TaskGroup::TaskGroup(&taskGroup);
  if (LVar1 == DECREASING_Y) {
    dy = dy2;
  }
  uVar25 = 0;
  do {
    if (dy == iVar21) {
      IlmThread_2_5::TaskGroup::~TaskGroup(&taskGroup);
      ppTVar3 = (this->_data->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar8 = (this->_data->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar23 = (string *)0x0;
      for (lVar22 = 0; (long)ppTVar8 - (long)ppTVar3 >> 3 != lVar22; lVar22 = lVar22 + 1) {
        pTVar4 = ppTVar3[lVar22];
        psVar24 = (string *)&pTVar4->_sem;
        if (psVar23 != (string *)0x0) {
          psVar24 = psVar23;
        }
        if ((pTVar4->exception).field_2._M_local_buf[0xc] != '\0') {
          psVar23 = psVar24;
        }
        (pTVar4->exception).field_2._M_local_buf[0xc] = '\0';
      }
      if (psVar23 == (string *)0x0) {
        IlmThread_2_5::Lock::~Lock((Lock *)&_iex_replace_s);
        return;
      }
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::IoExc::IoExc(this_01,psVar23);
      __cxa_throw(this_01,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
    }
    uVar25 = (ulong)(int)uVar25;
    for (dx = iVar13; dx <= dx2; dx = dx + 1) {
      bVar12 = isValidTile(this,dx,dy,lx,ly);
      if (!bVar12) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar19 = std::operator<<(local_330,"Tile (");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,dx);
        poVar19 = std::operator<<(poVar19,", ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,dy);
        poVar19 = std::operator<<(poVar19,", ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,lx);
        poVar19 = std::operator<<(poVar19,",");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,ly);
        std::operator<<(poVar19,") is not a valid tile.");
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pDVar2 = this->_data;
      ppTVar3 = (pDVar2->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar4 = ppTVar3[uVar25 % (ulong)((long)(pDVar2->tileBuffers).
                                              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppTVar3 >> 3)];
      IlmThread_2_5::Semaphore::wait();
      *(int *)((long)&(pTVar4->exception)._M_string_length + 4) = dx;
      *(int *)&(pTVar4->exception).field_2 = dy;
      *(int *)((long)&(pTVar4->exception).field_2 + 4) = lx;
      *(int *)((long)&(pTVar4->exception).field_2 + 8) = ly;
      pTVar4->compressor = (Compressor *)0x0;
      pIVar5 = pDVar2->_streamData;
      pIVar15 = TileOffsets::operator()(&pDVar2->tileOffsets,dx,dy,lx,ly);
      IVar6 = *pIVar15;
      if (IVar6 == 0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar19 = std::operator<<(local_330,"Tile (");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,dx);
        poVar19 = std::operator<<(poVar19,", ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,dy);
        poVar19 = std::operator<<(poVar19,", ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,lx);
        poVar19 = std::operator<<(poVar19,", ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,ly);
        std::operator<<(poVar19,") is missing.");
        pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar18,(stringstream *)&_iex_throw_s);
        __cxa_throw(pIVar18,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if ((pDVar2->version & 0x1000) == 0) {
        IVar16 = pIVar5->currentPosition;
      }
      else {
        iVar14 = (*pIVar5->is->_vptr_IStream[5])();
        IVar16 = CONCAT44(extraout_var,iVar14);
      }
      if (IVar16 != IVar6) {
        (*pIVar5->is->_vptr_IStream[6])(pIVar5->is,IVar6);
      }
      if (((pDVar2->version & 0x1000) != 0) &&
         ((*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,4),
         __iex_throw_s != pDVar2->partNumber)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar19 = std::operator<<(local_330,"Unexpected part number ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,__iex_throw_s);
        poVar19 = std::operator<<(poVar19,", should be ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,pDVar2->partNumber);
        std::operator<<(poVar19,".");
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,4);
      iVar14 = __iex_throw_s;
      (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,4);
      iVar9 = __iex_throw_s;
      (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,4);
      iVar10 = __iex_throw_s;
      (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,4);
      iVar11 = __iex_throw_s;
      (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,8);
      n = __iex_throw_s;
      v = &pTVar4->dy;
      lVar22 = CONCAT44(uStack_33c,__iex_throw_s);
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar5->is,(unsigned_long *)v);
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar5->is,(unsigned_long *)&pTVar4->ly);
      Xdr::skip<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar5->is,n);
      if (dx != iVar14) {
        pcVar26 = "Unexpected tile x coordinate.";
LAB_00150367:
        pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar18,pcVar26);
        __cxa_throw(pIVar18,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if (iVar9 != dy) {
        pcVar26 = "Unexpected tile y coordinate.";
        goto LAB_00150367;
      }
      if (iVar10 != lx) {
        pcVar26 = "Unexpected tile x level number coordinate.";
        goto LAB_00150367;
      }
      if (iVar11 != ly) {
        pcVar26 = "Unexpected tile y level number coordinate.";
        goto LAB_00150367;
      }
      iVar14 = (*pIVar5->is->_vptr_IStream[2])();
      if ((char)iVar14 == '\0') {
        if (*(void **)&pTVar4->format != (void *)0x0) {
          operator_delete__(*(void **)&pTVar4->format);
        }
        uVar7._0_4_ = pTVar4->dy;
        uVar7._4_4_ = pTVar4->lx;
        pvVar17 = operator_new__(uVar7);
        *(void **)&pTVar4->format = pvVar17;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,pvVar17,uVar7 & 0xffffffff);
      }
      else {
        iVar14 = (*pIVar5->is->_vptr_IStream[4])(pIVar5->is,(ulong)(uint)*v);
        pTVar4->format = iVar14;
        pTVar4->dx = extraout_var_00;
      }
      pIVar5->currentPosition = *(long *)v + IVar6 + lVar22 + 0x28;
      this_00 = (Task *)operator_new(0x20);
      IlmThread_2_5::Task::Task(this_00,&taskGroup);
      *(undefined ***)this_00 = &PTR__TileBufferTask_00366ba8;
      *(Data **)(this_00 + 0x10) = pDVar2;
      *(TileBuffer **)(this_00 + 0x18) = pTVar4;
      IlmThread_2_5::ThreadPool::addGlobalTask(this_00);
      uVar25 = uVar25 + 1;
    }
    dy = dy + (uint)(LVar1 != DECREASING_Y) * 2 + -1;
  } while( true );
}

Assistant:

void
DeepTiledInputFile::readTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //

    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                               "as pixel data destination.");

        if (!isValidLevel (lx, ly))
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");

        //
        // Determine the first and last tile coordinates in both dimensions.
        // We always attempt to read the range of tiles in the order that
        // they are stored in the file.
        //

        if (dx1 > dx2)
            std::swap (dx1, dx2);

        if (dy1 > dy2)
            std::swap (dy1, dy2);

        int dyStart = dy1;
        int dyStop  = dy2 + 1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;
            int tileNumber = 0;

            for (int dy = dyStart; dy != dyStop; dy += dY)
            {
                for (int dx = dx1; dx <= dx2; dx++)
                {
                    if (!isValidTile (dx, dy, lx, ly))
                        THROW (IEX_NAMESPACE::ArgExc,
                               "Tile (" << dx << ", " << dy << ", " <<
                               lx << "," << ly << ") is not a valid tile.");

                    ThreadPool::addGlobalTask (newTileBufferTask (&taskGroup,
                                                                  _data,
                                                                  tileNumber++,
                                                                  dx, dy,
                                                                  lx, ly));
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exeption handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledInputFile::readTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string *exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size(); ++i)
        {
            TileBuffer *tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception)
            throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}